

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_fdcc65::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  string *psVar1;
  pointer *ppDVar2;
  pointer *ppPVar3;
  uint uVar4;
  _Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> _Var5;
  pointer pDVar6;
  pointer this_00;
  pointer __first;
  cmMakefile *pcVar7;
  pointer puVar8;
  cmInstallGenerator *pcVar9;
  long *plVar10;
  cmFileAPI *pcVar11;
  undefined8 *puVar12;
  pointer pPVar13;
  cmStateSnapshot s;
  cmStateSnapshot s_00;
  cmStateSnapshot s_01;
  cmStateSnapshot s_02;
  cmStateSnapshot s_03;
  cmStateSnapshot s_04;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar14;
  bool bVar15;
  __type _Var16;
  ArrayIndex AVar17;
  TargetType TVar18;
  ArrayIndex value;
  Value *pVVar19;
  pointer __result;
  long lVar20;
  ulong uVar21;
  pointer pDVar22;
  pointer pDVar23;
  pointer pDVar24;
  mapped_type_conflict1 *pmVar25;
  ulong uVar26;
  pointer pPVar27;
  pointer pPVar28;
  pointer pPVar29;
  ulong uVar30;
  cmGlobalGenerator *pcVar31;
  string *psVar32;
  cmLocalGenerator *this_01;
  mapped_type *pmVar33;
  cmValue value_00;
  Value *this_02;
  _Tp_alloc_type *p_Var34;
  _Tp_alloc_type *__alloc;
  size_type sVar35;
  pointer ppcVar36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *this_03;
  pointer pDVar37;
  cmState *this_04;
  size_type *top;
  undefined8 *puVar38;
  Directory *__p;
  CodemodelConfig *pCVar39;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __i;
  pointer ppcVar40;
  _Tp_alloc_type *this_05;
  pointer ppcVar41;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  _Tp_alloc_type *p_Var42;
  long *plVar43;
  long lVar44;
  pointer puVar45;
  cmGeneratorTarget *pcVar46;
  cmStateSnapshot ps;
  allocator<char> local_469;
  string *local_468;
  Value *local_460;
  _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_458;
  Value childIndexes;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  ValueHolder local_408;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_400;
  PositionType local_3f8;
  pointer local_3e0;
  string sourceDir;
  char *local_3a8;
  cmStateSnapshot parentDir;
  string prefix;
  string buildDir;
  string buildDirRel;
  Target t;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_460 = __return_storage_ptr__;
  Json::Value::Value((Value *)&t,this->Config);
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar19,(Value *)&t);
  Json::Value::~Value((Value *)&t);
  _Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  puVar38 = *(undefined8 **)
             ((long)_Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98);
  local_468 = *(string **)
               ((long)_Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0);
  this_03 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)((long)local_468 - (long)puVar38 >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < this_03) {
    local_3a8 = "vector::reserve";
LAB_0033230c:
    std::__throw_length_error(local_3a8);
  }
  pDVar22 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var34 = (_Tp_alloc_type *)0x50;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar22) / 0x50) <
      this_03) {
    pDVar6 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::_M_allocate(this_03,(size_t)puVar38);
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::_S_relocate((this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_finish,__result,p_Var34);
    this_00 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar20 = (long)(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    std::
    _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)this_00,(pointer)(lVar20 / 0x50),lVar20 % 0x50);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar6 - (long)pDVar22) + (long)__result);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_03;
    puVar38 = *(undefined8 **)
               ((long)_Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98);
    local_468 = *(string **)
                 ((long)_Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0)
    ;
  }
  local_458 = (_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&this->DirectoryMap;
  local_3e0 = (pointer)&this->ProjectMap;
  local_3a8 = "vector::_M_realloc_insert";
  for (; pDVar24 = (this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish, (string *)puVar38 != local_468;
      puVar38 = puVar38 + 1) {
    pDVar37 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar20 = (long)pDVar24 - (long)pDVar37;
    __p = (Directory *)0x50;
    uVar21 = lVar20 / 0x50;
    if (pDVar24 ==
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if (lVar20 == 0x7fffffffffffffd0) goto LAB_0033230c;
      uVar26 = uVar21;
      if (pDVar24 == pDVar37) {
        uVar26 = 1;
      }
      p_Var34 = (_Tp_alloc_type *)(uVar26 + uVar21);
      if ((_Tp_alloc_type *)0x199999999999998 < p_Var34) {
        p_Var34 = (_Tp_alloc_type *)0x199999999999999;
      }
      this_05 = (_Tp_alloc_type *)0x199999999999999;
      if (!CARRY8(uVar26,uVar21)) {
        this_05 = p_Var34;
      }
      pDVar22 = std::
                _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ::_M_allocate((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                               *)this_05,0x50);
      std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>::
      construct<(anonymous_namespace)::CodemodelConfig::Directory>
                ((allocator_type *)(lVar20 + (long)pDVar22),__p);
      pDVar23 = std::
                vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ::_S_relocate(pDVar37,pDVar24,pDVar22,p_Var34);
      pDVar24 = std::
                vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ::_S_relocate(pDVar24,pDVar24,pDVar23 + 1,p_Var34);
      lVar20 = (long)(this->Directories).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar37;
      std::
      _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       *)pDVar37,(pointer)(lVar20 / 0x50),lVar20 % 0x50);
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_start = pDVar22;
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_finish = pDVar24;
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar22 + (long)this_05;
    }
    else {
      std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>::
      construct<(anonymous_namespace)::CodemodelConfig::Directory>
                ((allocator_type *)pDVar24,(Directory *)0x50);
      ppDVar2 = &(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar2 = *ppDVar2 + 1;
      pDVar22 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    cmLocalGenerator::GetStateSnapshot
              ((cmStateSnapshot *)&childIndexes,(cmLocalGenerator *)*puVar38);
    cmStateSnapshot::GetBuildsystemDirectory((cmStateSnapshot *)&t,(cmStateSnapshot *)&childIndexes)
    ;
    pDVar22 = pDVar22 + (uVar21 & 0xffffffff);
    (pDVar22->Snapshot).Position.Position = (PositionType)t.TopSource._M_dataplus._M_p;
    (pDVar22->Snapshot).State = (cmState *)t.GT;
    (pDVar22->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)t.Config;
    pDVar22->LocalGenerator = (cmLocalGenerator *)*puVar38;
    pmVar25 = std::
              map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
              ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                            *)local_458,&pDVar22->Snapshot);
    *pmVar25 = (UInt)uVar21;
    local_3f8 = (pDVar22->Snapshot).Position.Position;
    local_408.map_ = (ObjectValues *)(pDVar22->Snapshot).State;
    pcStack_400 = (pDVar22->Snapshot).Position.Tree;
    sourceDir._M_dataplus._M_p = (pointer)local_408.map_;
    sourceDir._M_string_length = (size_type)pcStack_400;
    sourceDir.field_2._M_allocated_capacity = local_3f8;
    cmStateSnapshot::GetBuildsystemDirectoryParent(&ps,(cmStateSnapshot *)&sourceDir);
    bVar15 = cmStateSnapshot::IsValid(&ps);
    if (bVar15) {
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&t,&ps);
      cmStateSnapshot::GetProjectName_abi_cxx11_
                ((string *)&childIndexes,(cmStateSnapshot *)&sourceDir);
      _Var16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &t,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&childIndexes);
      std::__cxx11::string::~string((string *)&childIndexes);
      std::__cxx11::string::~string((string *)&t);
      if (!_Var16) goto LAB_00330fca;
      s.Position.Tree = ps.Position.Tree;
      s.State = ps.State;
      s.Position.Position = ps.Position.Position;
      AVar17 = GetDirectoryIndex(this,s);
      uVar26 = (ulong)(this->Directories).
                      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                      ._M_impl.super__Vector_impl_data._M_start[AVar17].ProjectIndex;
    }
    else {
LAB_00330fca:
      __first = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar29 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar26 = ((long)pPVar29 - (long)__first) / 0x98;
      if (pPVar29 ==
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if ((long)pPVar29 - (long)__first == 0x7fffffffffffffc8) goto LAB_0033230c;
        uVar30 = uVar26;
        if (pPVar29 == __first) {
          uVar30 = 1;
        }
        __alloc = (_Tp_alloc_type *)(uVar30 + uVar26);
        if ((_Tp_alloc_type *)0xd79435e50d7942 < __alloc) {
          __alloc = (_Tp_alloc_type *)0xd79435e50d7943;
        }
        p_Var42 = (_Tp_alloc_type *)0xd79435e50d7943;
        if (!CARRY8(uVar30,uVar26)) {
          p_Var42 = __alloc;
        }
        pCVar39 = this;
        if (p_Var42 == (_Tp_alloc_type *)0x0) {
          pPVar27 = (pointer)0x0;
        }
        else {
          pPVar27 = (pointer)operator_new((long)p_Var42 * 0x98);
        }
        std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
        construct<(anonymous_namespace)::CodemodelConfig::Project>
                  ((allocator_type *)(pPVar27 + uVar26),(Project *)pCVar39);
        pPVar28 = std::
                  vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ::_S_relocate(__first,pPVar29,pPVar27,__alloc);
        pPVar29 = std::
                  vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ::_S_relocate(pPVar29,pPVar29,pPVar28 + 1,(_Tp_alloc_type *)0x98);
        lVar20 = (long)(this->Projects).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
        std::
        _Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                         *)__first,(pointer)(lVar20 / 0x98),lVar20 % 0x98);
        (this->Projects).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar27;
        (this->Projects).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar29;
        (this->Projects).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar27 + (long)p_Var42;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
        construct<(anonymous_namespace)::CodemodelConfig::Project>
                  ((allocator_type *)pPVar29,(Project *)this);
        ppPVar3 = &(this->Projects).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar3 = *ppPVar3 + 1;
        pPVar27 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar30 = uVar26 & 0xffffffff;
      pPVar27[uVar30].Snapshot.Position.Position = sourceDir.field_2._M_allocated_capacity;
      pPVar27[uVar30].Snapshot.State = (cmState *)sourceDir._M_dataplus._M_p;
      pPVar27[uVar30].Snapshot.Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)sourceDir._M_string_length;
      pmVar25 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                              *)local_3e0,(key_type *)&sourceDir);
      *pmVar25 = (UInt)uVar26;
      bVar15 = cmStateSnapshot::IsValid(&ps);
      if (bVar15) {
        s_00.Position.Tree = ps.Position.Tree;
        s_00.State = ps.State;
        s_00.Position.Position = ps.Position.Position;
        AVar17 = GetDirectoryIndex(this,s_00);
        uVar4 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[AVar17].ProjectIndex;
        pPVar27[uVar30].ParentIndex = uVar4;
        pPVar27 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&t,(UInt)uVar26);
        Json::Value::append(&pPVar27[uVar4].ChildIndexes,(Value *)&t);
        Json::Value::~Value((Value *)&t);
      }
    }
    pDVar22->ProjectIndex = (ArrayIndex)uVar26;
    pPVar27 = (this->Projects).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
              ._M_impl.super__Vector_impl_data._M_start;
    Json::Value::Value((Value *)&t,(UInt)uVar21);
    Json::Value::append(&pPVar27[uVar26 & 0xffffffff].DirectoryIndexes,(Value *)&t);
    Json::Value::~Value((Value *)&t);
  }
LAB_0033122d:
  pDVar37 = pDVar24;
  if (pDVar37 !=
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pDVar24 = pDVar37 + -1;
    pcVar7 = (pDVar37[-1].LocalGenerator)->Makefile;
    puVar45 = (pcVar7->InstallGenerators).
              super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pcVar7->InstallGenerators).
             super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar45 == puVar8) {
        if ((pDVar37[-1].HasInstallRule & 1U) != 0) goto LAB_0033122d;
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&t,
                   &pDVar24->Snapshot);
        psVar1 = t.Config;
        pcVar46 = t.GT;
        goto LAB_003312b1;
      }
      pcVar9 = (puVar45->_M_t).
               super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
               .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
      if (pcVar9 == (cmInstallGenerator *)0x0) break;
      lVar20 = __dynamic_cast(pcVar9,&cmInstallGenerator::typeinfo,
                              &cmInstallSubdirectoryGenerator::typeinfo,0);
      puVar45 = puVar45 + 1;
    } while (lVar20 != 0);
    pDVar37[-1].HasInstallRule = true;
    goto LAB_0033122d;
  }
  Json::Value::Value((Value *)&local_408,arrayValue);
  targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  plVar10 = *(long **)((long)_Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0xa0);
  for (plVar43 = *(long **)((long)_Var5.super__Head_base<0UL,_cmGlobalGenerator_*,_false>.
                                  _M_head_impl + 0x98);
      ppcVar41 = targetList.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
      ppcVar36 = targetList.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start, plVar43 != plVar10; plVar43 = plVar43 + 1
      ) {
    ::cm::
    append<std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>,_0>
              (&targetList,
               (vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                *)(*plVar43 + 0x148));
  }
  if (targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar44 = (long)targetList.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)targetList.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar21 = lVar44 >> 3;
    lVar20 = 0x3f;
    if (uVar21 != 0) {
      for (; uVar21 >> lVar20 == 0; lVar20 = lVar20 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
              (targetList.
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start,
               targetList.
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar44 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (ppcVar36,ppcVar41);
    }
    else {
      ppcVar40 = ppcVar36 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (ppcVar36,ppcVar40);
      for (; ppcVar40 != ppcVar41; ppcVar40 = ppcVar40 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (ppcVar40);
      }
    }
  }
  ppcVar36 = targetList.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  psVar1 = &this->TopBuild;
  local_458 = (_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&this->TargetIndexMap;
  ppcVar41 = targetList.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  while( true ) {
    if (ppcVar41 == ppcVar36) break;
    pcVar46 = *ppcVar41;
    TVar18 = cmGeneratorTarget::GetType(pcVar46);
    if ((TVar18 != GLOBAL_TARGET) && (bVar15 = cmGeneratorTarget::IsInBuildSystem(pcVar46), bVar15))
    {
      AVar17 = Json::Value::size((Value *)&local_408);
      t.Config = this->Config;
      parentDir.State = (cmState *)pcVar46;
      t.GT = pcVar46;
      pcVar31 = cmGeneratorTarget::GetGlobalGenerator(pcVar46);
      psVar32 = cmake::GetHomeDirectory_abi_cxx11_(pcVar31->CMakeInstance);
      std::__cxx11::string::string((string *)&t.TopSource,(string *)psVar32);
      pcVar31 = cmGeneratorTarget::GetGlobalGenerator(pcVar46);
      psVar32 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar31->CMakeInstance);
      std::__cxx11::string::string((string *)&t.TopBuild,(string *)psVar32);
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                (&t.SourceGroupsLocal,&(t.GT)->Makefile->SourceGroups);
      std::__cxx11::string::string((string *)&childIndexes,(string *)&t.TopSource);
      BacktraceData::BacktraceData(&t.Backtraces,(string *)&childIndexes);
      std::__cxx11::string::~string((string *)&childIndexes);
      t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_header;
      t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      t.SourceMap._M_h._M_buckets = &t.SourceMap._M_h._M_single_bucket;
      t.SourceMap._M_h._M_bucket_count = 1;
      t.SourceMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      t.SourceMap._M_h._M_element_count = 0;
      t.SourceMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      t.SourceMap._M_h._M_rehash_policy._M_next_resize = 0;
      t.SourceMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           t.CompileDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Json::Value::Value(&t.Sources,arrayValue);
      t.SourceGroupsMap._M_h._M_buckets = &t.SourceGroupsMap._M_h._M_single_bucket;
      t.SourceGroupsMap._M_h._M_bucket_count = 1;
      t.SourceGroupsMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      t.SourceGroupsMap._M_h._M_element_count = 0;
      t.SourceGroupsMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      t.SourceGroups.
      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      t.SourceGroups.
      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      t.SourceGroupsMap._M_h._M_rehash_policy._M_next_resize = 0;
      t.SourceGroupsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      t.SourceGroups.
      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      t.CompileGroupMap._M_h._M_buckets = &t.CompileGroupMap._M_h._M_single_bucket;
      t.CompileGroupMap._M_h._M_bucket_count = 1;
      t.CompileGroupMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      t.CompileGroupMap._M_h._M_element_count = 0;
      t.CompileGroupMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      t.CompileGroups.
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      t.CompileGroups.
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      t.CompileGroupMap._M_h._M_rehash_policy._M_next_resize = 0;
      t.CompileGroupMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      t.CompileGroups.
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar32 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar46);
      std::operator+(&prefix,"target-",psVar32);
      for (sVar35 = 0; prefix._M_string_length != sVar35; sVar35 = sVar35 + 1) {
        if ((prefix._M_dataplus._M_p[sVar35] == '\\') || (prefix._M_dataplus._M_p[sVar35] == '/')) {
          prefix._M_dataplus._M_p[sVar35] = '_';
        }
      }
      if (this->Config->_M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &childIndexes,"-",this->Config);
        std::__cxx11::string::append((string *)&prefix);
        std::__cxx11::string::~string((string *)&childIndexes);
      }
      pcVar11 = this->FileAPI;
      Target::Dump(&childIndexes,&t);
      cmFileAPI::MaybeJsonFile((Value *)&sourceDir,pcVar11,&childIndexes,&prefix);
      Json::Value::~Value(&childIndexes);
      psVar32 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar46);
      Json::Value::Value((Value *)&ps,psVar32);
      pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"name");
      Json::Value::operator=(pVVar19,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      TargetId(&buildDir,pcVar46,psVar1);
      Json::Value::Value((Value *)&ps,&buildDir);
      pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"id");
      Json::Value::operator=(pVVar19,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      std::__cxx11::string::~string((string *)&buildDir);
      this_01 = cmGeneratorTarget::GetLocalGenerator(pcVar46);
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&buildDir,this_01);
      cmStateSnapshot::GetBuildsystemDirectory(&ps,(cmStateSnapshot *)&buildDir);
      s_02.Position.Tree = ps.Position.Tree;
      s_02.State = ps.State;
      s_02.Position.Position = ps.Position.Position;
      value = GetDirectoryIndex(this,s_02);
      Json::Value::Value((Value *)&ps,value);
      pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"directoryIndex");
      Json::Value::operator=(pVVar19,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      pDVar22 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&ps,AVar17);
      Json::Value::append(&pDVar22[value].TargetIndexes,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      uVar4 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[value].ProjectIndex;
      Json::Value::Value((Value *)&ps,uVar4);
      pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"projectIndex");
      Json::Value::operator=(pVVar19,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      pPVar27 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&ps,AVar17);
      Json::Value::append(&pPVar27[uVar4].TargetIndexes,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      pmVar33 = std::__detail::
                _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_458,(key_type *)&parentDir);
      *pmVar33 = AVar17;
      std::__cxx11::string::~string((string *)&prefix);
      Target::~Target(&t);
      Json::Value::append((Value *)&local_408,(Value *)&sourceDir);
      Json::Value::~Value((Value *)&sourceDir);
    }
    ppcVar41 = ppcVar41 + 1;
  }
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&targetList.
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
  pVVar19 = Json::Value::operator[](local_460,"targets");
  Json::Value::operator=(pVVar19,(Value *)&local_408);
  Json::Value::~Value((Value *)&local_408);
  Json::Value::Value((Value *)&prefix,arrayValue);
  pDVar22 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3e0 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_468 = &this->TopSource;
  do {
    top = &t.TopSource._M_string_length;
    if (pDVar22 == local_3e0) {
      pVVar19 = Json::Value::operator[](local_460,"directories");
      Json::Value::operator=(pVVar19,(Value *)&prefix);
      Json::Value::~Value((Value *)&prefix);
      Json::Value::Value((Value *)&ps,arrayValue);
      pPVar13 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar27 = (this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_start; pVVar19 = local_460,
          pPVar27 != pPVar13; pPVar27 = pPVar27 + 1) {
        Json::Value::Value(&childIndexes,objectValue);
        cmStateSnapshot::GetProjectName_abi_cxx11_(&sourceDir,&pPVar27->Snapshot);
        Json::Value::Value((Value *)&t,&sourceDir);
        pVVar19 = Json::Value::operator[](&childIndexes,"name");
        Json::Value::operator=(pVVar19,(Value *)&t);
        Json::Value::~Value((Value *)&t);
        std::__cxx11::string::~string((string *)&sourceDir);
        if (pPVar27->ParentIndex != 0xffffffff) {
          Json::Value::Value((Value *)&t,pPVar27->ParentIndex);
          pVVar19 = Json::Value::operator[](&childIndexes,"parentIndex");
          Json::Value::operator=(pVVar19,(Value *)&t);
          Json::Value::~Value((Value *)&t);
        }
        bVar15 = Json::Value::empty(&pPVar27->ChildIndexes);
        if (!bVar15) {
          pVVar19 = Json::Value::operator[](&childIndexes,"childIndexes");
          Json::Value::operator=(pVVar19,&pPVar27->ChildIndexes);
        }
        pVVar19 = Json::Value::operator[](&childIndexes,"directoryIndexes");
        Json::Value::operator=(pVVar19,&pPVar27->DirectoryIndexes);
        bVar15 = Json::Value::empty(&pPVar27->TargetIndexes);
        if (!bVar15) {
          pVVar19 = Json::Value::operator[](&childIndexes,"targetIndexes");
          Json::Value::operator=(pVVar19,&pPVar27->TargetIndexes);
        }
        Json::Value::append((Value *)&ps,&childIndexes);
        Json::Value::~Value(&childIndexes);
      }
      this_02 = Json::Value::operator[](local_460,"projects");
      Json::Value::operator=(this_02,(Value *)&ps);
      Json::Value::~Value((Value *)&ps);
      return pVVar19;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetList,"directory",(allocator<char> *)&t);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&t,&pDVar22->Snapshot);
    psVar32 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&t);
    cmSystemTools::RelativeIfUnder((string *)&parentDir,local_468,psVar32);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&t,&pDVar22->Snapshot);
    psVar32 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&t);
    cmSystemTools::RelativeIfUnder(&buildDirRel,psVar1,psVar32);
    bVar15 = cmsys::SystemTools::FileIsFullPath(&buildDirRel);
    if (bVar15) {
      bVar15 = cmsys::SystemTools::FileIsFullPath((string *)&parentDir);
      if (!bVar15) {
        childIndexes.value_.bool_ = true;
        cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                  ((string *)&t,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targetList,
                   (char *)&childIndexes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parentDir);
        goto LAB_00331a52;
      }
    }
    else {
      childIndexes.value_.bool_ = true;
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                ((string *)&t,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targetList,
                 (char *)&childIndexes,&buildDirRel);
LAB_00331a52:
      std::__cxx11::string::operator=((string *)&targetList,(string *)&t);
      std::__cxx11::string::~string((string *)&t);
    }
    for (ppcVar36 = (pointer)0x0;
        targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppcVar36;
        ppcVar36 = (pointer)((long)ppcVar36 + 1)) {
      if ((*(char *)((long)targetList.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)ppcVar36) == '\\') ||
         (*(char *)((long)targetList.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)ppcVar36) == '/')) {
        *(undefined1 *)
         ((long)targetList.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)ppcVar36) = 0x2e;
      }
    }
    __rhs = this->Config;
    if (__rhs->_M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,"-",
                     __rhs);
      std::__cxx11::string::append((string *)&targetList);
      std::__cxx11::string::~string((string *)&t);
      __rhs = this->Config;
    }
    pcVar46 = (cmGeneratorTarget *)pDVar22->LocalGenerator;
    t.TopSource._M_dataplus._M_p = (pointer)local_458;
    t.GT = pcVar46;
    t.Config = __rhs;
    psVar32 = cmake::GetHomeDirectory_abi_cxx11_
                        ((cmake *)(pcVar46->CompileOptionsCache)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_left[3]._M_right);
    std::__cxx11::string::string((string *)top,(string *)psVar32);
    psVar32 = cmake::GetHomeOutputDirectory_abi_cxx11_
                        ((cmake *)(pcVar46->CompileOptionsCache)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_left[3]._M_right);
    std::__cxx11::string::string((string *)&t.TopBuild._M_string_length,(string *)psVar32);
    std::__cxx11::string::string((string *)&childIndexes,(string *)top);
    BacktraceData::BacktraceData
              ((BacktraceData *)
               &t.SourceGroupsLocal.
                super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)&childIndexes);
    std::__cxx11::string::~string((string *)&childIndexes);
    pcVar11 = this->FileAPI;
    Json::Value::Value((Value *)&sourceDir,objectValue);
    Json::Value::Value((Value *)&ps,objectValue);
    psVar32 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_((cmLocalGenerator *)t.GT);
    cmSystemTools::RelativeIfUnder(&buildDir,(string *)top,psVar32);
    Json::Value::Value(&childIndexes,&buildDir);
    pVVar19 = Json::Value::operator[]((Value *)&ps,"source");
    Json::Value::operator=(pVVar19,&childIndexes);
    Json::Value::~Value(&childIndexes);
    std::__cxx11::string::~string((string *)&buildDir);
    psVar32 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)t.GT);
    cmSystemTools::RelativeIfUnder(&buildDir,(string *)&t.TopBuild._M_string_length,psVar32);
    Json::Value::Value(&childIndexes,&buildDir);
    pVVar19 = Json::Value::operator[]((Value *)&ps,"build");
    Json::Value::operator=(pVVar19,&childIndexes);
    Json::Value::~Value(&childIndexes);
    std::__cxx11::string::~string((string *)&buildDir);
    pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"paths");
    Json::Value::operator=(pVVar19,(Value *)&ps);
    Json::Value::~Value((Value *)&ps);
    Json::Value::Value((Value *)&ps,arrayValue);
    lVar20 = *(long *)&((t.GT)->CompileOptionsCache)._M_t._M_impl;
    puVar12 = *(undefined8 **)(lVar20 + 0x220);
    for (puVar38 = *(undefined8 **)(lVar20 + 0x218); puVar38 != puVar12; puVar38 = puVar38 + 1) {
      DirectoryObject::DumpInstaller
                (&childIndexes,(DirectoryObject *)&t,(cmInstallGenerator *)*puVar38);
      bVar15 = Json::Value::empty(&childIndexes);
      if (!bVar15) {
        Json::Value::append((Value *)&ps,&childIndexes);
      }
      Json::Value::~Value(&childIndexes);
    }
    pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"installers");
    Json::Value::operator=(pVVar19,(Value *)&ps);
    Json::Value::~Value((Value *)&ps);
    BacktraceData::Dump(&childIndexes,
                        (BacktraceData *)
                        &t.SourceGroupsLocal.
                         super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    pVVar19 = Json::Value::operator[]((Value *)&sourceDir,"backtraceGraph");
    Json::Value::operator=(pVVar19,&childIndexes);
    Json::Value::~Value(&childIndexes);
    cmFileAPI::MaybeJsonFile((Value *)&local_408,pcVar11,(Value *)&sourceDir,(string *)&targetList);
    Json::Value::~Value((Value *)&sourceDir);
    DirectoryObject::~DirectoryObject((DirectoryObject *)&t);
    std::__cxx11::string::~string((string *)&buildDirRel);
    std::__cxx11::string::~string((string *)&parentDir);
    std::__cxx11::string::~string((string *)&targetList);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&t,&pDVar22->Snapshot);
    psVar32 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&t);
    std::__cxx11::string::string((string *)&sourceDir,(string *)psVar32);
    cmSystemTools::RelativeIfUnder((string *)&childIndexes,local_468,&sourceDir);
    Json::Value::Value((Value *)&t,(String *)&childIndexes);
    pVVar19 = Json::Value::operator[]((Value *)&local_408,"source");
    Json::Value::operator=(pVVar19,(Value *)&t);
    Json::Value::~Value((Value *)&t);
    std::__cxx11::string::~string((string *)&childIndexes);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&t,&pDVar22->Snapshot);
    psVar32 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&t);
    std::__cxx11::string::string((string *)&buildDir,(string *)psVar32);
    cmSystemTools::RelativeIfUnder((string *)&childIndexes,psVar1,&buildDir);
    Json::Value::Value((Value *)&t,(String *)&childIndexes);
    pVVar19 = Json::Value::operator[]((Value *)&local_408,"build");
    Json::Value::operator=(pVVar19,(Value *)&t);
    Json::Value::~Value((Value *)&t);
    std::__cxx11::string::~string((string *)&childIndexes);
    cmStateSnapshot::GetBuildsystemDirectoryParent(&parentDir,&pDVar22->Snapshot);
    bVar15 = cmStateSnapshot::IsValid(&parentDir);
    if (bVar15) {
      s_03.Position.Tree = parentDir.Position.Tree;
      s_03.State = parentDir.State;
      s_03.Position.Position = parentDir.Position.Position;
      AVar17 = GetDirectoryIndex(this,s_03);
      Json::Value::Value((Value *)&t,AVar17);
      pVVar19 = Json::Value::operator[]((Value *)&local_408,"parentIndex");
      Json::Value::operator=(pVVar19,(Value *)&t);
      Json::Value::~Value((Value *)&t);
    }
    Json::Value::Value(&childIndexes,arrayValue);
    cmStateSnapshot::GetChildren
              ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&ps,&pDVar22->Snapshot);
    pcVar14 = ps.Position.Tree;
    for (this_04 = ps.State; this_04 != (cmState *)pcVar14;
        this_04 = (cmState *)
                  &(this_04->PropertyDefinitions).Map_._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left) {
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&buildDirRel,(cmStateSnapshot *)this_04);
      s_04.Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)buildDirRel._M_string_length;
      s_04.State = (cmState *)buildDirRel._M_dataplus._M_p;
      s_04.Position.Position = buildDirRel.field_2._M_allocated_capacity;
      AVar17 = GetDirectoryIndex(this,s_04);
      Json::Value::Value((Value *)&t,AVar17);
      Json::Value::append(&childIndexes,(Value *)&t);
      Json::Value::~Value((Value *)&t);
    }
    std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
              ((_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&ps);
    bVar15 = Json::Value::empty(&childIndexes);
    if (!bVar15) {
      pVVar19 = Json::Value::operator[]((Value *)&local_408,"childIndexes");
      Json::Value::operator=(pVVar19,&childIndexes);
    }
    Json::Value::Value((Value *)&t,pDVar22->ProjectIndex);
    pVVar19 = Json::Value::operator[]((Value *)&local_408,"projectIndex");
    Json::Value::operator=(pVVar19,(Value *)&t);
    Json::Value::~Value((Value *)&t);
    bVar15 = Json::Value::empty(&pDVar22->TargetIndexes);
    if (!bVar15) {
      pVVar19 = Json::Value::operator[]((Value *)&local_408,"targetIndexes");
      Json::Value::operator=(pVVar19,&pDVar22->TargetIndexes);
    }
    targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)(pDVar22->Snapshot).Position.Position;
    targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)(pDVar22->Snapshot).State;
    targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)(pDVar22->Snapshot).Position.Tree;
    Json::Value::Value((Value *)&ps,nullValue);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&t,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_469);
    value_00 = cmStateSnapshot::GetDefinition((cmStateSnapshot *)&targetList,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
    if (value_00.Value != (string *)0x0) {
      Json::Value::Value((Value *)&t,objectValue);
      Json::Value::operator=((Value *)&ps,(Value *)&t);
      Json::Value::~Value((Value *)&t);
      Json::Value::Value((Value *)&t,value_00.Value);
      pVVar19 = Json::Value::operator[]((Value *)&ps,"string");
      Json::Value::operator=(pVVar19,(Value *)&t);
      Json::Value::~Value((Value *)&t);
    }
    bVar15 = Json::Value::isNull((Value *)&ps);
    if (!bVar15) {
      pVVar19 = Json::Value::operator[]((Value *)&local_408,"minimumCMakeVersion");
      Json::Value::operator=(pVVar19,(Value *)&ps);
    }
    if (pDVar22->HasInstallRule == true) {
      Json::Value::Value((Value *)&t,true);
      pVVar19 = Json::Value::operator[]((Value *)&local_408,"hasInstallRule");
      Json::Value::operator=(pVVar19,(Value *)&t);
      Json::Value::~Value((Value *)&t);
    }
    Json::Value::~Value((Value *)&ps);
    Json::Value::~Value(&childIndexes);
    std::__cxx11::string::~string((string *)&buildDir);
    std::__cxx11::string::~string((string *)&sourceDir);
    Json::Value::append((Value *)&prefix,(Value *)&local_408);
    Json::Value::~Value((Value *)&local_408);
    pDVar22 = pDVar22 + 1;
  } while( true );
LAB_003312b1:
  if (pcVar46 == (cmGeneratorTarget *)psVar1) goto LAB_00331300;
  cmStateSnapshot::GetBuildsystemDirectory
            ((cmStateSnapshot *)&childIndexes,(cmStateSnapshot *)pcVar46);
  s_01.State._1_7_ = childIndexes.value_.int_._1_7_;
  s_01.State._0_1_ = childIndexes.value_.bool_;
  s_01.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)childIndexes._8_8_;
  s_01.Position.Position =
       (PositionType)
       childIndexes.comments_.ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  AVar17 = GetDirectoryIndex(this,s_01);
  if ((this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_start[AVar17].HasInstallRule == true) {
    pDVar37[-1].HasInstallRule = true;
    goto LAB_00331300;
  }
  pcVar46 = (cmGeneratorTarget *)&pcVar46->GlobalGenerator;
  goto LAB_003312b1;
LAB_00331300:
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
            ((_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&t);
  goto LAB_0033122d;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}